

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

parser_error parse_ghost_flags_off(parser *p)

{
  long *plVar1;
  _Bool _Var2;
  errr eVar3;
  void *pvVar4;
  long *plVar5;
  char *pcVar6;
  char *flag_name;
  
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    __assert_fail("g",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                  ,0x846,"enum parser_error parse_ghost_flags_off(struct parser *)");
  }
  plVar1 = *(long **)((long)pvVar4 + 0x18);
  do {
    plVar5 = plVar1;
    plVar1 = (long *)*plVar5;
  } while (plVar1 != (long *)0x0);
  _Var2 = parser_hasval(p,"flags");
  if (_Var2) {
    pcVar6 = parser_getstr(p,"flags");
    pcVar6 = string_make(pcVar6);
    flag_name = strtok(pcVar6," |");
    if (flag_name != (char *)0x0) {
      do {
        eVar3 = grab_flag((bitflag *)((long)plVar5 + 0x54),0xc,r_info_flags,flag_name);
        if (eVar3 != 0) {
          mem_free(pcVar6);
          quit_fmt("bad mf-flag: %s",flag_name);
          return PARSE_ERROR_INVALID_FLAG;
        }
        flag_name = strtok((char *)0x0," |");
      } while (flag_name != (char *)0x0);
    }
    mem_free(pcVar6);
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_ghost_flags_off(struct parser *p) {
	struct ghost *g = parser_priv(p);
	struct ghost_level *l;
	char *flags;
	char *s;
	assert(g);
	l = g->level;
	while (l->next) {
		l = l->next;
	}

	if (!parser_hasval(p, "flags"))
		return PARSE_ERROR_NONE;
	flags = string_make(parser_getstr(p, "flags"));
	s = strtok(flags, " |");
	while (s) {
		if (grab_flag(l->flags_off, RF_SIZE, r_info_flags, s)) {
			mem_free(flags);
			quit_fmt("bad mf-flag: %s", s);
			return PARSE_ERROR_INVALID_FLAG;
		}
		s = strtok(NULL, " |");
	}

	mem_free(flags);
	return PARSE_ERROR_NONE;
}